

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modalgamepad.cpp
# Opt level: O0

void handleArgs(char **argv,uint argc,Settings *settings)

{
  char *pcVar1;
  bool bVar2;
  const_reference this;
  string_type local_d8;
  undefined1 local_b8 [8];
  smatch match;
  undefined1 local_90 [8];
  string arg;
  uint i;
  undefined1 local_60 [8];
  regex configRegex;
  string configFile;
  Settings *settings_local;
  uint argc_local;
  char **argv_local;
  
  std::__cxx11::string::string
            ((string *)
             &configRegex._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_60,"config=(.*)",0x10);
  for (arg.field_2._8_4_ = 0; (uint)arg.field_2._8_4_ < argc;
      arg.field_2._8_4_ = arg.field_2._8_4_ + 1) {
    pcVar1 = argv[(uint)arg.field_2._8_4_];
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_90,pcVar1,(allocator *)((long)&match._M_begin._M_current + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&match._M_begin._M_current + 7));
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_b8);
    bVar2 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                       ,(match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)local_b8,(basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_60
                       ,0);
    if (bVar2) {
      this = std::__cxx11::
             match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                           *)local_b8,1);
      std::__cxx11::sub_match::operator_cast_to_string(&local_d8,(sub_match *)this);
      std::__cxx11::string::operator=((string *)&settings->configFile,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_b8);
    std::__cxx11::string::~string((string *)local_90);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_60);
  std::__cxx11::string::~string
            ((string *)
             &configRegex._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

void handleArgs(char const** argv, unsigned int argc, Settings& settings)
{
  std::string configFile;
  std::regex configRegex("config=(.*)");

  for(unsigned int i = 0; i < argc; ++i)
  {
    std::string arg(argv[i]);
    std::smatch match;
    if(std::regex_match(arg, match, configRegex))
    {
      settings.configFile = match[1];
    }
  }
}